

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O1

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdateCheckTermination_Test::TestBody
          (OsqpTest_GetAndUpdateCheckTermination_Test *this)

{
  anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 *paVar1;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  bool bVar3;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  OsqpSolver solver;
  AssertionResult gtest_ar;
  OsqpSettings settings;
  AssertHelper local_1a8;
  AssertHelper local_1a0;
  anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 local_198;
  anon_union_8_1_1246618d_for_StatusOrData<long_long>_1 local_190;
  anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 local_188;
  AssertHelper local_180;
  undefined1 local_178 [8];
  undefined1 local_170 [8];
  anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  Scalar *local_150;
  CompressedStorage<double,_long_long> local_148;
  void *local_128;
  StorageIndex *local_100;
  Scalar *local_f8;
  CompressedStorage<double,_long_long> local_f0;
  void *local_d0;
  void *local_c0;
  OsqpSettings local_b0;
  
  OsqpSettings::OsqpSettings(&local_b0);
  local_b0.check_termination = 0xc;
  local_178 = (undefined1  [8])0x0;
  GetToyProblem();
  OsqpSolver::Init((OsqpSolver *)&local_1a0,(OsqpInstance *)local_178,(OsqpSettings *)local_170);
  local_190.status_.rep_._0_1_ =
       (StatusRep *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) == (StatusRep *)0x1;
  local_188.data_ = 0;
  if (((uint)local_1a0.data_ & 1) == 0) {
    absl::status_internal::StatusRep::Unref
              ((StatusRep *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_));
  }
  free(local_c0);
  free(local_d0);
  free(local_100);
  free(local_f8);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_f0);
  free(local_128);
  free((void *)local_160._8_8_);
  free(local_150);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_148);
  if (local_190.status_.rep_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)&local_190.status_,
               (AssertionResult *)"solver.Init(GetToyProblem(), settings).ok()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x355,(char *)CONCAT71(local_170._1_7_,local_170[0]));
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
LAB_0012bf0a:
    paVar1 = &local_188;
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((undefined1 *)CONCAT71(local_170._1_7_,local_170[0]) != local_170 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_170._1_7_,local_170[0]),
                      local_160._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) + 8))();
    }
    local_168 = local_188;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188.data_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_0012c082;
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188.data_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    }
    local_190.status_.rep_._0_4_ = OsqpSolver::Solve((OsqpSolver *)local_178);
    local_1a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)local_170,"solver.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&local_190,(OsqpExitCode *)&local_1a0);
    if (local_170[0] != (internal)0x0) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_170 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168)
        ;
      }
      OsqpSolver::GetCheckTermination((OsqpSolver *)&local_190.status_);
      bVar3 = CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) == 1;
      local_1a0.data_._0_4_ = CONCAT31(local_1a0.data_._1_3_,bVar3);
      local_198.data_ = 0;
      if (bVar3) {
        if (CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) != 1) {
          absl::internal_statusor::Helper::Crash(&local_190.status_);
        }
        local_1a0.data_._0_4_ = 0xc;
        testing::internal::CmpHelperEQ<long_long,int>
                  ((internal *)local_170,"*check_termination","12",&local_188.data_,
                   (int *)&local_1a0);
        if (local_170[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_168;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x35b,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_170 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168);
        }
        absl::internal_statusor::StatusOrData<long_long>::~StatusOrData
                  ((StatusOrData<long_long> *)&local_190.status_);
        OsqpSolver::UpdateCheckTermination((OsqpSolver *)local_170,(c_int)local_178);
        local_190.status_.rep_._0_1_ =
             (StatusRep *)CONCAT71(local_170._1_7_,local_170[0]) == (StatusRep *)0x1;
        local_188.data_ = 0;
        if (((byte)local_170[0] & 1) == 0) {
          absl::status_internal::StatusRep::Unref
                    ((StatusRep *)CONCAT71(local_170._1_7_,local_170[0]));
        }
        if (local_190.status_.rep_._0_1_ == '\0') {
          testing::Message::Message((Message *)&local_1a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_170,(internal *)&local_190.status_,
                     (AssertionResult *)"solver.UpdateCheckTermination(13).ok()","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x35e,(char *)CONCAT71(local_170._1_7_,local_170[0]));
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
          goto LAB_0012bf0a;
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188.data_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_188);
        }
        OsqpSolver::GetCheckTermination((OsqpSolver *)&local_190.status_);
        bVar3 = CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) == 1;
        local_1a0.data_._0_4_ = CONCAT31(local_1a0.data_._1_3_,bVar3);
        local_198.data_ = 0;
        if (!bVar3) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_170,(internal *)&local_1a0,
                     (AssertionResult *)"check_termination.ok()","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x361,(char *)CONCAT71(local_170._1_7_,local_170[0]));
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_1a8);
          goto LAB_0012bfd1;
        }
        if (CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) != 1) {
          absl::internal_statusor::Helper::Crash(&local_190.status_);
        }
        local_1a0.data_._0_4_ = 0xd;
        testing::internal::CmpHelperEQ<long_long,int>
                  ((internal *)local_170,"*check_termination","13",&local_188.data_,
                   (int *)&local_1a0);
        if (local_170[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_168;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x362,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          paVar1 = (anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 *)(local_170 + 8);
          goto LAB_0012c012;
        }
      }
      else {
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_170,(internal *)&local_1a0,
                   (AssertionResult *)"check_termination.ok()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x35a,(char *)CONCAT71(local_170._1_7_,local_170[0]));
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_1a8);
LAB_0012bfd1:
        paVar1 = &local_198;
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((undefined1 *)CONCAT71(local_170._1_7_,local_170[0]) != local_170 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_170._1_7_,local_170[0]),
                          local_160._M_allocated_capacity + 1);
        }
        if (local_1a8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_1a8.data_ + 8))();
        }
        local_168 = local_198;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198.data_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_0012c012:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)paVar1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168);
        }
      }
      absl::internal_statusor::StatusOrData<long_long>::~StatusOrData
                ((StatusOrData<long_long> *)&local_190.status_);
      goto LAB_0012c082;
    }
    testing::Message::Message((Message *)&local_190.status_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x356,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_190.status_);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if ((long *)CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) != (long *)0x0)
    {
      (**(code **)(*(long *)CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) + 8)
      )();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_0012c082;
    paVar1 = (anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 *)(local_170 + 8);
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)paVar1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
LAB_0012c082:
  std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::~unique_ptr
            ((unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)local_178);
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdateCheckTermination) {
  OsqpSettings settings;
  settings.check_termination = 12;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto check_termination = solver.GetCheckTermination();
    ASSERT_TRUE(check_termination.ok());
    EXPECT_EQ(*check_termination, 12);
  }

  ASSERT_TRUE(solver.UpdateCheckTermination(13).ok());
  {
    const auto check_termination = solver.GetCheckTermination();
    ASSERT_TRUE(check_termination.ok());
    EXPECT_EQ(*check_termination, 13);
  }
}